

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * chaiscript::json::JSON::json_escape(string *__return_storage_ptr__,string *str)

{
  char __c;
  size_type sVar1;
  pointer pcVar2;
  char *__s;
  size_type sVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = str->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      __c = pcVar2[sVar3];
      switch(__c) {
      case '\b':
        __s = "\\b";
        break;
      case '\t':
        __s = "\\t";
        break;
      case '\n':
        __s = "\\n";
        break;
      case '\v':
switchD_002c72a2_caseD_b:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,__c);
        goto LAB_002c72fa;
      case '\f':
        __s = "\\f";
        break;
      case '\r':
        __s = "\\r";
        break;
      default:
        __s = "\\\\";
        if (__c != '\\') {
          if (__c != '\"') goto switchD_002c72a2_caseD_b;
          __s = "\\\"";
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,__s);
LAB_002c72fa:
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string json_escape(const std::string &str) {
      std::string output;
      for (char i : str) {
        switch (i) {
          case '\"':
            output += "\\\"";
            break;
          case '\\':
            output += "\\\\";
            break;
          case '\b':
            output += "\\b";
            break;
          case '\f':
            output += "\\f";
            break;
          case '\n':
            output += "\\n";
            break;
          case '\r':
            output += "\\r";
            break;
          case '\t':
            output += "\\t";
            break;
          default:
            output += i;
            break;
        }
      }
      return output;
    }